

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

Symbol * slang::ast::anon_unknown_39::getContainingPackage(Symbol *symbol)

{
  Scope *this;
  Symbol *in_RDI;
  Scope *scope;
  Symbol *curr;
  Symbol *local_18;
  
  local_18 = in_RDI;
  while( true ) {
    if (local_18->kind == Package) {
      return local_18;
    }
    if (local_18->kind == InstanceBody) break;
    this = Symbol::getParentScope(local_18);
    if (this == (Scope *)0x0) {
      return (Symbol *)0x0;
    }
    local_18 = Scope::asSymbol(this);
  }
  return (Symbol *)0x0;
}

Assistant:

const Symbol* getContainingPackage(const Symbol& symbol) {
    auto curr = &symbol;
    while (true) {
        if (curr->kind == SymbolKind::Package)
            return curr;

        if (curr->kind == SymbolKind::InstanceBody)
            return nullptr;

        auto scope = curr->getParentScope();
        if (!scope)
            return nullptr;

        curr = &scope->asSymbol();
    }
}